

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O2

void __thiscall KDReports::Test::testFontScaling(Test *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  AutoTableElement *pAVar4;
  reference pQVar5;
  QFont *pQVar6;
  QStandardItemModel *pQVar7;
  uint uVar8;
  QLatin1String latin1;
  QLatin1String latin1_00;
  QArrayDataPointer<QRect> local_98;
  Report report;
  AutoTableElement tableElement;
  char16_t *local_60;
  QArrayDataPointer<char16_t> local_48;
  QRect local_30;
  
  if (fontFound) {
    fillModel(this,2,0x19,false);
    KDReports::Report::Report(&report,(QObject *)0x0);
    KDReports::Report::setReportMode((ReportMode)&report);
    latin1.m_data = "Noto Sans";
    latin1.m_size = 9;
    QString::QString((QString *)&tableElement,latin1);
    QFont::QFont((QFont *)&local_98,(QString *)&tableElement,0x18,-1,false);
    KDReports::Report::setDefaultFont((QFont *)&report);
    QFont::~QFont((QFont *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
    pQVar7 = &this->m_model;
    KDReports::AutoTableElement::AutoTableElement(&tableElement,(QAbstractItemModel *)pQVar7);
    KDReports::AutoTableElement::setHorizontalHeaderVisible(SUB81(&tableElement,0));
    KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&tableElement,0));
    pAVar4 = (AutoTableElement *)KDReports::Report::mainTable();
    KDReports::MainTable::setAutoTableElement(pAVar4);
    iVar3 = KDReports::Report::numberOfPages();
    cVar1 = QTest::qCompare(iVar3,2,"report.numberOfPages()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                            ,0x54);
    if (cVar1 != '\0') {
      KDReports::Report::mainTable();
      KDReports::MainTable::pageRects();
      cVar1 = QTest::qCompare(local_98.size,2,"report.mainTable()->pageRects().count()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                              ,0x55);
      QArrayDataPointer<QRect>::~QArrayDataPointer(&local_98);
      if (cVar1 != '\0') {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        pQVar5 = QList<QRect>::operator[]((QList<QRect> *)&local_98,0);
        iVar3 = pQVar5->y2 - pQVar5->y1;
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_98);
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        pQVar5 = QList<QRect>::operator[]((QList<QRect> *)&local_98,0);
        local_48.d = (Data *)0x0;
        uVar8 = iVar3 + 1;
        local_48.ptr = (char16_t *)CONCAT44(iVar3,1);
        bVar2 = QTest::qCompare<QRect,QRect>
                          (pQVar5,(QRect *)&local_48,"report.mainTable()->pageRects()[0]",
                           "QRect(0, 0, 2, rowsFirstPage)",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x59);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_98);
        if (bVar2) {
          KDReports::Report::mainTable();
          KDReports::MainTable::pageRects();
          pQVar5 = QList<QRect>::operator[]((QList<QRect> *)&local_98,1);
          local_48.d = (Data *)0xffffffffffffffff;
          local_48.ptr = (char16_t *)0x0;
          local_48.size = 0;
          local_30.y2 = QStandardItemModel::rowCount((QModelIndex *)pQVar7);
          local_30._0_8_ = (ulong)uVar8 << 0x20;
          local_30.x2 = 1;
          local_30.y2 = local_30.y2 + -1;
          bVar2 = QTest::qCompare<QRect,QRect>
                            (pQVar5,&local_30,"report.mainTable()->pageRects()[1]",
                             "QRect(0, rowsFirstPage, 2, m_model.rowCount() - rowsFirstPage)",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x5a);
          QArrayDataPointer<QRect>::~QArrayDataPointer(&local_98);
          if (bVar2) {
            KDReports::AutoTableElement::setHorizontalHeaderVisible(SUB81(&tableElement,0));
            pAVar4 = (AutoTableElement *)KDReports::Report::mainTable();
            KDReports::MainTable::setAutoTableElement(pAVar4);
            pQVar6 = (QFont *)KDReports::Report::mainTable();
            latin1_00.m_data = "Noto Sans";
            latin1_00.m_size = 9;
            QString::QString((QString *)&local_98,latin1_00);
            QFont::QFont((QFont *)&local_48,(QString *)&local_98,0x30,-1,false);
            KDReports::MainTable::setHorizontalHeaderFont(pQVar6);
            QFont::~QFont((QFont *)&local_48);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_98);
            iVar3 = KDReports::Report::numberOfPages();
            cVar1 = QTest::qCompare(iVar3,2,"report.numberOfPages()","2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                    ,0x60);
            if (cVar1 != '\0') {
              KDReports::Report::mainTable();
              KDReports::MainTable::pageRects();
              pQVar5 = QList<QRect>::operator[]((QList<QRect> *)&local_98,0);
              cVar1 = QTest::qVerify((pQVar5->y2 - pQVar5->y1) + 1 < (int)uVar8,
                                     "report.mainTable()->pageRects()[0].height() < rowsFirstPage",
                                     "",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x61);
              QArrayDataPointer<QRect>::~QArrayDataPointer(&local_98);
              if (cVar1 != '\0') {
                KDReports::Report::setFontScalingFactor(0.2);
                iVar3 = KDReports::Report::numberOfPages();
                cVar1 = QTest::qCompare(iVar3,1,"report.numberOfPages()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                        ,0x65);
                if (cVar1 != '\0') {
                  KDReports::Report::mainTable();
                  local_98.d = (Data *)KDReports::MainTable::lastAutoFontScalingFactor();
                  local_48.d = (Data *)0x3fc999999999999a;
                  cVar1 = QTest::qCompare((double *)&local_98,(double *)&local_48,
                                          "report.mainTable()->lastAutoFontScalingFactor()","0.2",
                                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                          ,0x66);
                  if (cVar1 != '\0') {
                    KDReports::Report::mainTable();
                    KDReports::MainTable::pageRects();
                    pQVar5 = QList<QRect>::operator[]((QList<QRect> *)&local_98,0);
                    local_48.d = (Data *)0xffffffffffffffff;
                    local_48.ptr = (char16_t *)0x0;
                    local_48.size = 0;
                    local_30.y2 = QStandardItemModel::rowCount((QModelIndex *)pQVar7);
                    local_30.x1 = 0;
                    local_30.y1 = 0;
                    local_30.x2 = 1;
                    local_30.y2 = local_30.y2 + -1;
                    QTest::qCompare<QRect,QRect>
                              (pQVar5,&local_30,"report.mainTable()->pageRects()[0]",
                               "QRect(0, 0, 2, m_model.rowCount())",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x67);
                    QArrayDataPointer<QRect>::~QArrayDataPointer(&local_98);
                  }
                }
              }
            }
          }
        }
      }
    }
    KDReports::AutoTableElement::~AutoTableElement(&tableElement);
    KDReports::Report::~Report(&report);
  }
  else {
    QString::QString((QString *)&local_98,"Font %1 not found");
    QString::QString((QString *)&local_48,"Noto Sans");
    QString::arg((QString *)&report,(int)&local_98,(QChar)(char16_t)&local_48);
    QString::toLatin1_helper_inplace((QString *)&tableElement);
    if (local_60 == (char16_t *)0x0) {
      local_60 = (char16_t *)&QByteArray::_empty;
    }
    QTest::qSkip((char *)local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0x4a);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&tableElement);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  }
  return;
}

Assistant:

void testFontScaling()
    {
        SKIP_IF_FONT_NOT_FOUND

        fillModel(2, 25);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 24));
        AutoTableElement tableElement(&m_model);
        tableElement.setHorizontalHeaderVisible(false);
        tableElement.setVerticalHeaderVisible(false);
        report.mainTable()->setAutoTableElement(tableElement);
        QCOMPARE(report.numberOfPages(), 2);
        QCOMPARE(report.mainTable()->pageRects().count(), 2);

#ifndef Q_OS_MAC // Somehow the mac gets different font size for the headers, even compared to linux with DPI 72.
        const int rowsFirstPage = report.mainTable()->pageRects()[0].height();
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 2, rowsFirstPage));
        QCOMPARE(report.mainTable()->pageRects()[1], QRect(0, rowsFirstPage, 2, m_model.rowCount() - rowsFirstPage));

        // Now show a huge horizontal header, and check we have less rows per page
        tableElement.setHorizontalHeaderVisible(true);
        report.mainTable()->setAutoTableElement(tableElement);
        report.mainTable()->setHorizontalHeaderFont(QFont(QLatin1String(s_fontName), 48));
        QCOMPARE(report.numberOfPages(), 2);
        QVERIFY(report.mainTable()->pageRects()[0].height() < rowsFirstPage);

        // Now force a very small font scaling factor
        report.setFontScalingFactor(0.2);
        QCOMPARE(report.numberOfPages(), 1);
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 0.2);
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 2, m_model.rowCount()));
#endif
    }